

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O2

void __thiscall
QCryptographicHashPrivate::State::finalizeUnchecked(State *this,Algorithm method,HashResult *result)

{
  uchar *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [12];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  uint uVar29;
  Sha3Variant sha3Variant;
  uint uVar30;
  SHA3Context *pSVar31;
  uchar *__s;
  long lVar32;
  ulong uVar33;
  long in_FS_OFFSET;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  SHA3Context local_228;
  ulong local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(method) {
  case Md4:
    memcpy(&local_228,this,0x98);
    uVar33 = (ulong)(local_228.state._0_4_ & 0x3f);
    puVar1 = local_228.state + 0x18;
    lVar32 = uVar33 + 1;
    local_228.state[uVar33 + 0x18] = 0x80;
    uVar33 = uVar33 ^ 0x3f;
    if (uVar33 < 8) {
      memset(puVar1 + lVar32,0,uVar33);
      uVar33 = 0x40;
      body((md4_context *)&local_228,puVar1,0x40);
      lVar32 = 0;
    }
    memset(puVar1 + lVar32,0,uVar33 - 8);
    local_228.state[0x51] = (uchar)((uint)local_228.state._0_4_ >> 5);
    local_228.state[0x50] = (uchar)(local_228.state._0_4_ * 8);
    local_228.state[0x52] = (uchar)((uint)local_228.state._0_4_ >> 0xd);
    local_228.state[0x53] = (uchar)((uint)local_228.state._0_4_ >> 0x15);
    local_228.state[0x54] = local_228.state[4];
    local_228.state[0x55] = local_228.state[5];
    local_228.state[0x56] = local_228.state[6];
    local_228.state[0x57] = local_228.state[7];
    local_228.state._0_4_ = local_228.state._0_4_ * 8;
    body((md4_context *)&local_228,puVar1,0x40);
    *(undefined4 *)(result->m_data)._M_elems = local_228.state._8_4_;
    *(undefined4 *)((result->m_data)._M_elems + 4) = local_228.state._12_4_;
    *(undefined4 *)((result->m_data)._M_elems + 8) = local_228.state._16_4_;
    *(undefined4 *)((result->m_data)._M_elems + 0xc) = local_228.state._20_4_;
    break;
  case Md5:
    pSVar31 = &local_228;
    for (lVar32 = 0x16; lVar32 != 0; lVar32 = lVar32 + -1) {
      *(undefined4 *)pSVar31 = *(undefined4 *)this;
      this = this + 4;
      pSVar31 = (SHA3Context *)((long)pSVar31 + 4);
    }
    uVar30 = local_228.state._16_4_ & 0x3f;
    puVar1 = local_228.state + 0x18;
    local_228.state[(ulong)uVar30 + 0x18] = 0x80;
    uVar29 = 0x37 - uVar30;
    __s = local_228.state + (ulong)uVar30 + 0x19;
    if (0x37 < uVar30) {
      memset(local_228.state + (ulong)uVar30 + 0x19,0,(ulong)(uVar30 ^ 0x3f));
      MD5Transform((UWORD32 *)&local_228,(UWORD32 *)puVar1);
      uVar29 = 0x38;
      __s = puVar1;
    }
    memset(__s,0,(ulong)uVar29);
    local_228.state._84_4_ = local_228.state._20_4_ << 3 | (uint)local_228.state._16_4_ >> 0x1d;
    local_228.state._80_4_ = local_228.state._16_4_ * 8;
    MD5Transform((UWORD32 *)&local_228,(UWORD32 *)puVar1);
    *(ulong *)(result->m_data)._M_elems = CONCAT44(local_228.state._4_4_,local_228.state._0_4_);
    *(ulong *)((result->m_data)._M_elems + 8) =
         CONCAT44(local_228.state._12_4_,local_228.state._8_4_);
    break;
  case Sha1:
    pSVar31 = &local_228;
    for (lVar32 = 0xc; lVar32 != 0; lVar32 = lVar32 + -1) {
      *(undefined8 *)pSVar31 = *(undefined8 *)this;
      this = this + 8;
      pSVar31 = (SHA3Context *)((long)pSVar31 + 8);
    }
    uVar33 = local_228.state._24_8_ * 8;
    local_80 = uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
               (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8 |
               (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 | (uVar33 & 0xff00) << 0x28
               | local_228.state._24_8_ << 0x3b;
    sha1Update((Sha1State *)&local_228,(uchar *)anon_var_dwarf_d6f256,1);
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    uVar29 = local_228.state._24_4_ & 0x3f;
    if (uVar29 < 0x38) {
      uVar33 = (ulong)(0x37 - uVar29);
    }
    else {
      sha1Update((Sha1State *)&local_228,local_78,(ulong)(uVar29 ^ 0x3f));
      uVar33 = 0x38;
    }
    sha1Update((Sha1State *)&local_228,local_78,uVar33);
    sha1Update((Sha1State *)&local_228,(uchar *)&local_80,8);
    auVar25[8] = local_228.state[8];
    auVar25[9] = local_228.state[9];
    auVar25[10] = local_228.state[10];
    auVar25[0xb] = local_228.state[0xb];
    auVar25._0_8_ = CONCAT44(local_228.state._4_4_,local_228.state._0_4_);
    auVar35[0xc] = local_228.state[0xc];
    auVar35[0xd] = local_228.state[0xd];
    auVar35[0xe] = local_228.state[0xe];
    auVar35[0xf] = local_228.state[0xf];
    auVar35._0_12_ = auVar25;
    auVar37[1] = 0;
    auVar37[0] = local_228.state[8];
    auVar37[2] = local_228.state[9];
    auVar37[3] = 0;
    auVar37[4] = local_228.state[10];
    auVar37[5] = 0;
    auVar37[6] = local_228.state[0xb];
    auVar37[7] = 0;
    auVar37[8] = local_228.state[0xc];
    auVar37[9] = 0;
    auVar37[10] = local_228.state[0xd];
    auVar37[0xb] = 0;
    auVar37[0xc] = local_228.state[0xe];
    auVar37[0xd] = 0;
    auVar37[0xe] = local_228.state[0xf];
    auVar37[0xf] = 0;
    auVar36 = pshuflw(auVar37,auVar37,0x1b);
    auVar37 = pshufhw(auVar36,auVar36,0x1b);
    auVar18[0xd] = 0;
    auVar18._0_13_ = auVar35._0_13_;
    auVar18[0xe] = local_228.state[7];
    auVar19[0xc] = local_228.state[6];
    auVar19._0_12_ = auVar25;
    auVar19._13_2_ = auVar18._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar25._0_11_;
    auVar20._12_3_ = auVar19._12_3_;
    auVar21[10] = local_228.state[5];
    auVar21._0_10_ = auVar25._0_10_;
    auVar21._11_4_ = auVar20._11_4_;
    auVar22[9] = 0;
    auVar22._0_9_ = auVar25._0_9_;
    auVar22._10_5_ = auVar21._10_5_;
    auVar23[8] = local_228.state[4];
    auVar23._0_8_ = CONCAT44(local_228.state._4_4_,local_228.state._0_4_);
    auVar23._9_6_ = auVar22._9_6_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar23._8_7_;
    auVar27._1_8_ = SUB158(auVar26 << 0x40,7);
    auVar27[0] = local_228.state[3];
    auVar27._9_6_ = 0;
    auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
    auVar28[0] = local_228.state[2];
    auVar28._11_4_ = 0;
    auVar24[2] = local_228.state[1];
    auVar24._0_2_ = local_228.state._0_2_;
    auVar24._3_12_ = SUB1512(auVar28 << 0x20,3);
    auVar36._0_2_ = local_228.state._0_2_ & 0xff;
    auVar36._2_13_ = auVar24._2_13_;
    auVar36[0xf] = 0;
    auVar35 = pshuflw((undefined1  [16])0x0,auVar36,0x1b);
    auVar35 = pshufhw(auVar35,auVar35,0x1b);
    sVar2 = auVar35._0_2_;
    sVar3 = auVar35._2_2_;
    sVar4 = auVar35._4_2_;
    sVar5 = auVar35._6_2_;
    sVar6 = auVar35._8_2_;
    sVar7 = auVar35._10_2_;
    sVar8 = auVar35._12_2_;
    sVar9 = auVar35._14_2_;
    sVar10 = auVar37._0_2_;
    sVar11 = auVar37._2_2_;
    sVar12 = auVar37._4_2_;
    sVar13 = auVar37._6_2_;
    sVar14 = auVar37._8_2_;
    sVar15 = auVar37._10_2_;
    sVar16 = auVar37._12_2_;
    sVar17 = auVar37._14_2_;
    (result->m_data)._M_elems[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar35[0] - (0xff < sVar2);
    (result->m_data)._M_elems[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar35[2] - (0xff < sVar3);
    (result->m_data)._M_elems[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar35[4] - (0xff < sVar4);
    (result->m_data)._M_elems[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar35[6] - (0xff < sVar5);
    (result->m_data)._M_elems[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar35[8] - (0xff < sVar6);
    (result->m_data)._M_elems[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar35[10] - (0xff < sVar7);
    (result->m_data)._M_elems[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar35[0xc] - (0xff < sVar8);
    (result->m_data)._M_elems[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar35[0xe] - (0xff < sVar9);
    (result->m_data)._M_elems[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar37[0] - (0xff < sVar10);
    (result->m_data)._M_elems[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar37[2] - (0xff < sVar11);
    (result->m_data)._M_elems[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar37[4] - (0xff < sVar12);
    (result->m_data)._M_elems[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar37[6] - (0xff < sVar13);
    (result->m_data)._M_elems[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar37[8] - (0xff < sVar14);
    (result->m_data)._M_elems[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar37[10] - (0xff < sVar15)
    ;
    (result->m_data)._M_elems[0xe] =
         (0 < sVar16) * (sVar16 < 0x100) * auVar37[0xc] - (0xff < sVar16);
    (result->m_data)._M_elems[0xf] =
         (0 < sVar17) * (sVar17 < 0x100) * auVar37[0xe] - (0xff < sVar17);
    *(uint *)((result->m_data)._M_elems + 0x10) =
         (uint)local_228.state._16_4_ >> 0x18 | (local_228.state._16_4_ & 0xff0000) >> 8 |
         (local_228.state._16_4_ & 0xff00) << 8 | local_228.state._16_4_ << 0x18;
    break;
  case Sha224:
    pSVar31 = &local_228;
    for (lVar32 = 0x1d; lVar32 != 0; lVar32 = lVar32 + -1) {
      *(undefined4 *)pSVar31 = *(undefined4 *)this;
      this = this + 4;
      pSVar31 = (SHA3Context *)((long)pSVar31 + 4);
    }
    SHA224Result((SHA224Context *)&local_228,(uint8_t *)result);
    break;
  case Sha256:
    pSVar31 = &local_228;
    for (lVar32 = 0x1d; lVar32 != 0; lVar32 = lVar32 + -1) {
      *(undefined4 *)pSVar31 = *(undefined4 *)this;
      this = this + 4;
      pSVar31 = (SHA3Context *)((long)pSVar31 + 4);
    }
    SHA256Result((SHA256Context *)&local_228,(uint8_t *)result);
    break;
  case Sha384:
    memcpy(&local_228,this,0xe0);
    SHA384Result((SHA384Context *)&local_228,(uint8_t *)result);
    break;
  case Sha512:
    memcpy(&local_228,this,0xe0);
    SHA512Result((SHA512Context *)&local_228,(uint8_t *)result);
    break;
  case Keccak_224:
  case Keccak_256:
  case Keccak_384:
  case Keccak_512:
    memcpy(&local_228,this,0x1a0);
    sha3Variant = Keccak;
    goto LAB_0031a9e9;
  case RealSha3_224:
  case RealSha3_256:
  case RealSha3_384:
  case RealSha3_512:
    memcpy(&local_228,this,0x1a0);
    sha3Variant = Sha3;
LAB_0031a9e9:
    sha3Finish(&local_228,result,sha3Variant);
    break;
  case Blake2b_160:
  case Blake2b_256:
  case Blake2b_384:
  case Blake2b_512:
    uVar29 = hashLengthInternal(method);
    memcpy(&local_228,this,0xf8);
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    if (((ulong)local_228.dataQueue._32_8_ <= (ulong)uVar29) && (local_228.state._80_8_ == 0)) {
      bVar34 = CARRY8(local_228.state._64_8_,local_228.dataQueue._24_8_);
      local_228.state._64_8_ = local_228.state._64_8_ + local_228.dataQueue._24_8_;
      local_228.state._72_8_ = local_228.state._72_8_ + (ulong)bVar34;
      if (local_228.dataQueue[0x28] != '\0') {
        local_228.state[0x58] = 0xff;
        local_228.state[0x59] = 0xff;
        local_228.state[0x5a] = 0xff;
        local_228.state[0x5b] = 0xff;
        local_228.state[0x5c] = 0xff;
        local_228.state[0x5d] = 0xff;
        local_228.state[0x5e] = 0xff;
        local_228.state[0x5f] = 0xff;
      }
      local_228.state[0x50] = 0xff;
      local_228.state[0x51] = 0xff;
      local_228.state[0x52] = 0xff;
      local_228.state[0x53] = 0xff;
      local_228.state[0x54] = 0xff;
      local_228.state[0x55] = 0xff;
      local_228.state[0x56] = 0xff;
      local_228.state[0x57] = 0xff;
      memset(local_228.state + local_228.dataQueue._24_8_ + 0x60,0,0x80 - local_228.dataQueue._24_8_
            );
      blake2b_compress((blake2b_state *)&local_228,local_228.state + 0x60);
      for (lVar32 = 0; lVar32 != 8; lVar32 = lVar32 + 1) {
        *(undefined8 *)(local_78 + lVar32 * 8) = *(undefined8 *)(local_228.state + lVar32 * 8);
      }
      memcpy(result,local_78,local_228.dataQueue._32_8_);
      memset(local_78,0,0x40);
    }
    break;
  case Blake2s_128:
  case Blake2s_160:
  case Blake2s_224:
  case Blake2s_256:
    uVar29 = hashLengthInternal(method);
    memcpy(&local_228,this,0x88);
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    if (((ulong)local_228.state._120_8_ <= (ulong)uVar29) && (local_228.state._40_4_ == 0)) {
      bVar34 = CARRY4(local_228.state._32_4_,local_228.state._112_4_);
      local_228.state._32_4_ = local_228.state._32_4_ + local_228.state._112_4_;
      local_228.state._36_4_ = local_228.state._36_4_ + (uint)bVar34;
      if (local_228.state[0x80] != '\0') {
        local_228.state[0x2c] = 0xff;
        local_228.state[0x2d] = 0xff;
        local_228.state[0x2e] = 0xff;
        local_228.state[0x2f] = 0xff;
      }
      local_228.state[0x28] = 0xff;
      local_228.state[0x29] = 0xff;
      local_228.state[0x2a] = 0xff;
      local_228.state[0x2b] = 0xff;
      memset(local_228.state + local_228.state._112_8_ + 0x30,0,0x40 - local_228.state._112_8_);
      blake2s_compress((blake2s_state *)&local_228,local_228.state + 0x30);
      for (lVar32 = 0; lVar32 != 8; lVar32 = lVar32 + 1) {
        *(undefined4 *)(local_78 + lVar32 * 4) = *(undefined4 *)(local_228.state + lVar32 * 4);
      }
      memcpy(result,local_78,(ulong)uVar29);
      memset(local_78,0,0x20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCryptographicHashPrivate::State::finalizeUnchecked(QCryptographicHash::Algorithm method,
                                                         HashResult &result) noexcept
{
    switch (method) {
    case QCryptographicHash::Sha1: {
        Sha1State copy = sha1Context;
        sha1FinalizeState(&copy);
        sha1ToHash(&copy, result.data());
        break;
    }
    case QCryptographicHash::Md4: {
        md4_context copy = md4Context;
        md4_final(&copy, result.data());
        break;
    }
    case QCryptographicHash::Md5: {
        MD5Context copy = md5Context;
        MD5Final(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha224: {
        SHA224Context copy = sha224Context;
        SHA224Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha256: {
        SHA256Context copy = sha256Context;
        SHA256Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha384: {
        SHA384Context copy = sha384Context;
        SHA384Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::Sha512: {
        SHA512Context copy = sha512Context;
        SHA512Result(&copy, result.data());
        break;
    }
    case QCryptographicHash::RealSha3_224:
    case QCryptographicHash::RealSha3_256:
    case QCryptographicHash::RealSha3_384:
    case QCryptographicHash::RealSha3_512: {
        SHA3Context copy = sha3Context;
        sha3Finish(copy, result, Sha3Variant::Sha3);
        break;
    }
    case QCryptographicHash::Keccak_224:
    case QCryptographicHash::Keccak_256:
    case QCryptographicHash::Keccak_384:
    case QCryptographicHash::Keccak_512: {
        SHA3Context copy = sha3Context;
        sha3Finish(copy, result, Sha3Variant::Keccak);
        break;
    }
    case QCryptographicHash::Blake2b_160:
    case QCryptographicHash::Blake2b_256:
    case QCryptographicHash::Blake2b_384:
    case QCryptographicHash::Blake2b_512: {
        const auto length = hashLengthInternal(method);
        blake2b_state copy = blake2bContext;
        blake2b_final(&copy, result.data(), length);
        break;
    }
    case QCryptographicHash::Blake2s_128:
    case QCryptographicHash::Blake2s_160:
    case QCryptographicHash::Blake2s_224:
    case QCryptographicHash::Blake2s_256: {
        const auto length = hashLengthInternal(method);
        blake2s_state copy = blake2sContext;
        blake2s_final(&copy, result.data(), length);
        break;
    }
    case QCryptographicHash::NumAlgorithms:
        Q_UNREACHABLE();
    }
}